

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::HandleLevel4
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  _List_node_base *p_Var1;
  iterator iVar2;
  CurrentAndTwoMoreIter args;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  _List_node_base *p_Var8;
  static_string_view keyword;
  static_string_view keyword_00;
  
  p_Var1 = (newArgs->
           super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
           super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  p_Var8 = p_Var1;
  if (p_Var1 != (_List_node_base *)newArgs) {
    p_Var8 = p_Var1->_M_next;
  }
  iVar2._M_node = p_Var8;
  pcVar3 = DAT_00a68688;
  sVar4 = (anonymous_namespace)::keyOR;
  if (p_Var8 != (_List_node_base *)newArgs) {
    iVar2._M_node = p_Var8->_M_next;
  }
  while (iVar2._M_node != (_List_node_base *)newArgs) {
    keyword.super_string_view._M_str = DAT_00a68558;
    keyword.super_string_view._M_len = (anonymous_namespace)::keyAND;
    (anonymous_namespace)::keyOR = sVar4;
    DAT_00a68688 = pcVar3;
    bVar5 = IsKeyword(this,keyword,(cmExpandedCommandArgument *)(p_Var8 + 1));
    if ((bVar5) ||
       (keyword_00.super_string_view._M_str = pcVar3, keyword_00.super_string_view._M_len = sVar4,
       bVar6 = IsKeyword(this,keyword_00,(cmExpandedCommandArgument *)(p_Var8 + 1)), bVar6)) {
      bVar6 = GetBooleanValueWithAutoDereference
                        (this,(cmExpandedCommandArgument *)(p_Var1 + 1),errorString,status,false);
      bVar7 = GetBooleanValueWithAutoDereference
                        (this,(cmExpandedCommandArgument *)(iVar2._M_node + 1),errorString,status,
                         false);
      if (bVar5) {
        bVar6 = bVar6 && bVar7;
      }
      else {
        bVar6 = bVar6 || bVar7;
      }
      args.next._M_node = p_Var8;
      args.current._M_node = p_Var1;
      args.nextnext._M_node = iVar2._M_node;
      cmArgumentList::ReduceTwoArgs(newArgs,bVar6,args);
    }
    p_Var1 = p_Var1->_M_next;
    p_Var8 = p_Var1;
    if (p_Var1 != (_List_node_base *)newArgs) {
      p_Var8 = p_Var1->_M_next;
    }
    iVar2._M_node = p_Var8;
    pcVar3 = DAT_00a68688;
    sVar4 = (anonymous_namespace)::keyOR;
    if (p_Var8 != (_List_node_base *)newArgs) {
      iVar2._M_node = p_Var8->_M_next;
    }
  }
  (anonymous_namespace)::keyOR = sVar4;
  DAT_00a68688 = pcVar3;
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel4(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto args = newArgs.make3ArgsIterator(); args.nextnext != newArgs.end();
       args.advance(newArgs)) {

    int matchNo;

    if ((matchNo = this->matchKeys(*args.next, keyAND, keyOR))) {
      const auto lhs = this->GetBooleanValueWithAutoDereference(
        *args.current, errorString, status);
      const auto rhs = this->GetBooleanValueWithAutoDereference(
        *args.nextnext, errorString, status);
      // clang-format off
      const auto result =
        cmRt2CtSelector<
            std::logical_and, std::logical_or
          >::eval(matchNo, lhs, rhs);
      // clang-format on
      newArgs.ReduceTwoArgs(result, args);
    }
  }
  return true;
}